

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  char cVar1;
  GCtab *t_00;
  short sVar2;
  IRRef1 IVar3;
  BCReg func_00;
  TRef TVar4;
  int iVar5;
  TRef TVar6;
  TRef *pTVar7;
  TValue *pTVar8;
  cTValue *pcVar9;
  code *cont;
  bool bVar10;
  bool bVar11;
  cTValue *local_2e8;
  TRef fref;
  IRType t_1;
  TRef mtref;
  TRef key;
  cTValue *mo;
  int hasmm;
  int keybarrier;
  GCtab *mt;
  TRef res;
  IRType t;
  TRef tr;
  cTValue *val;
  TValue *tv;
  TRef *base;
  BCReg func;
  cTValue *oldv;
  uint local_278;
  int iStack_274;
  IRType1 rbguard;
  IRRef rbref;
  IROp loadop;
  IROp xrefop;
  TRef xref;
  RecordIndex *ix_local;
  jit_State *J_local;
  ushort local_144;
  uint local_134;
  
  do {
    if ((ix->tab & 0x1f000000) == 0xb000000) {
      if (((ix->keyv).u64 == 0xffffffffffffffff) ||
         (((uint)((int)(ix->keyv).field_4.it >> 0xf) < 0xfffffff2 &&
          (((ix->keyv).n != (ix->keyv).n || (NAN((ix->keyv).n) || NAN((ix->keyv).n))))))) {
        if (ix->val != 0) {
          lj_trace_err(J,LJ_TRERR_STORENN);
        }
        if ((ix->key & 0xffff) < 0x8000) {
          if ((ix->idxchain == 0) || (iVar5 = lj_record_mm_lookup(J,ix,MM_index), iVar5 == 0)) {
            return 0x7fff;
          }
          goto LAB_00193c0d;
        }
      }
      TVar4 = rec_idx_key(J,ix,&local_278,(IRType1 *)((long)&oldv + 7));
      loadop._0_2_ = (undefined2)TVar4;
      cVar1 = *(char *)((long)(J->cur).ir + (ulong)(TVar4 & 0xffff) * 8 + 5);
      iStack_274 = 0x43;
      if (cVar1 == '8') {
        iStack_274 = 0x42;
      }
      if (cVar1 == '\x1a') {
        local_2e8 = *(cTValue **)&(J->cur).ir[(ulong)(TVar4 & 0xffff) + 1].i;
      }
      else {
        local_2e8 = ix->oldv;
      }
      if (ix->val == 0) {
        if ((uint)((int)(local_2e8->field_4).it >> 0xf) < 0xfffffff2) {
          local_134 = 0xe;
        }
        else {
          local_134 = (int)(local_2e8->field_4).it >> 0xf ^ 0xffffffff;
        }
        if (local_2e8 == (cTValue *)&J[-1].penalty[0x32].val) {
          TVar4 = lj_ir_kptr_(J,IR_KKPTR,&J[-1].penalty[0x32].val);
          (J->fold).ins.field_0.ot = 0x889;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
          lj_opt_fold(J);
          mt._4_4_ = 0x7fff;
        }
        else {
          (J->fold).ins.field_0.ot = (ushort)(iStack_274 << 8) | (ushort)local_134 | 0x80;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = 0;
          mt._4_4_ = lj_opt_fold(J);
        }
        if ((mt._4_4_ & 0xffff) < local_278) {
          lj_ir_rollback(J,local_278);
          (J->guardemit).irt = oldv._7_1_;
        }
        if (((local_134 != 0) || (ix->idxchain == 0)) ||
           (iVar5 = lj_record_mm_lookup(J,ix,MM_index), iVar5 == 0)) {
          if (local_134 < 3) {
            mt._4_4_ = local_134 * 0xffffff + 0x7fff;
          }
          return mt._4_4_;
        }
      }
      else {
        t_00 = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
        bVar10 = false;
        if ((ix->key >> 0x18 & 0x1f) - 4 < 9) {
          bVar10 = (ix->val & 0x1f000000) != 0;
        }
        if ((TVar4 & 0xffff) < local_278) {
          lj_ir_rollback(J,local_278);
          (J->guardemit).irt = oldv._7_1_;
        }
        if (local_2e8->u64 != 0xffffffffffffffff) {
          iVar5 = lj_opt_fwd_wasnonnil(J,(IROpT)iStack_274,TVar4 & 0xffff);
          if (iVar5 == 0) {
            if (cVar1 == ':') {
              TVar4 = lj_ir_kptr_(J,IR_KKPTR,&J[-1].penalty[0x32].val);
              (J->fold).ins.field_0.ot = 0x989;
              (J->fold).ins.field_0.op1 = (undefined2)loadop;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
              lj_opt_fold(J);
            }
            if (ix->idxchain != 0) {
              if (t_00 == (GCtab *)0x0) {
                TVar4 = ix->tab;
                (J->fold).ins.field_0.ot = 0x450b;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
                (J->fold).ins.field_0.op2 = 5;
                TVar4 = lj_opt_fold(J);
                TVar6 = lj_ir_knull(J,IRT_TAB);
                (J->fold).ins.field_0.ot = 0x88b;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                lj_opt_fold(J);
              }
              else {
                if ((uint)((int)(local_2e8->field_4).it >> 0xf) < 0xfffffff2) {
                  local_144 = 0xe;
                }
                else {
                  local_144 = (ushort)((int)(local_2e8->field_4).it >> 0xf) ^ 0xffff;
                }
                (J->fold).ins.field_0.ot = (ushort)(iStack_274 << 8) | local_144 | 0x80;
                (J->fold).ins.field_0.op1 = (undefined2)loadop;
                (J->fold).ins.field_0.op2 = 0;
                lj_opt_fold(J);
              }
            }
          }
          else {
            bVar10 = false;
          }
LAB_00194d75:
          if ((ix->val >> 0x18 & 0x1f) - 0xf < 5) {
            TVar4 = ix->val;
            (J->fold).ins.field_0.ot = 0x5b0e;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (J->fold).ins.field_0.op2 = 0x1d3;
            TVar4 = lj_opt_fold(J);
            ix->val = TVar4;
          }
          TVar4 = ix->val;
          (J->fold).ins.field_0.ot =
               ((short)iStack_274 + 8) * 0x100 | (byte)(ix->val >> 0x18) & 0x1f;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
          lj_opt_fold(J);
          if ((bVar10) || ((ix->val >> 0x18 & 0x1f) - 4 < 9)) {
            TVar4 = ix->tab;
            (J->fold).ins.field_0.ot = 0x5800;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (J->fold).ins.field_0.op2 = 0;
            lj_opt_fold(J);
          }
          iVar5 = nommstr(J,ix->key);
          if (iVar5 == 0) {
            TVar4 = ix->tab;
            (J->fold).ins.field_0.ot = 0x3e09;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (J->fold).ins.field_0.op2 = 10;
            TVar4 = lj_opt_fold(J);
            TVar6 = lj_ir_kint(J,0);
            (J->fold).ins.field_0.ot = 0x4d10;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
            lj_opt_fold(J);
          }
          J->needsnap = '\x01';
          return 0;
        }
        bVar11 = false;
        if ((ix->idxchain != 0) && (t_00 != (GCtab *)0x0)) {
          pcVar9 = lj_tab_getstr(t_00,(GCstr *)J[-1].penalty[0x3e].pc.ptr64);
          bVar11 = false;
          if (pcVar9 != (cTValue *)0x0) {
            bVar11 = pcVar9->u64 != 0xffffffffffffffff;
          }
        }
        if (bVar11) {
          (J->fold).ins.field_0.ot = (ushort)(iStack_274 << 8) | 0x80;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = 0;
          lj_opt_fold(J);
        }
        else if (cVar1 == ':') {
          sVar2 = 9;
          if (local_2e8 == (cTValue *)&J[-1].penalty[0x32].val) {
            sVar2 = 8;
          }
          TVar4 = lj_ir_kptr_(J,IR_KKPTR,&J[-1].penalty[0x32].val);
          (J->fold).ins.field_0.ot = sVar2 << 8 | 0x89;
          (J->fold).ins.field_0.op1 = (undefined2)loadop;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
          lj_opt_fold(J);
        }
        if ((ix->idxchain == 0) || (iVar5 = lj_record_mm_lookup(J,ix,MM_newindex), iVar5 == 0)) {
          if (local_2e8 == (cTValue *)&J[-1].penalty[0x32].val) {
            t_1 = ix->key;
            IVar3 = (IRRef1)t_1;
            if ((t_1 >> 0x18 & 0x1f) - 0xf < 5) {
              (J->fold).ins.field_0.ot = 0x5b0e;
              (J->fold).ins.field_0.op1 = IVar3;
              (J->fold).ins.field_0.op2 = 0x1d3;
              TVar4 = lj_opt_fold(J);
              t_1._0_2_ = (undefined2)TVar4;
            }
            else {
              if ((t_1 & 0x1f000000) == 0xe000000) {
                if ((t_1 & 0xffff) < 0x8000) {
                  if ((ix->keyv).u64 == 0x8000000000000000) {
                    t_1 = lj_ir_knum_u64(J,0);
                  }
                }
                else {
                  (J->fold).ins.field_0.ot = 0x88e;
                  (J->fold).ins.field_0.op1 = IVar3;
                  (J->fold).ins.field_0.op2 = IVar3;
                  lj_opt_fold(J);
                }
              }
            }
            TVar4 = ix->tab;
            (J->fold).ins.field_0.ot = 0x3b09;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (J->fold).ins.field_0.op2 = (undefined2)t_1;
            TVar4 = lj_opt_fold(J);
            loadop._0_2_ = (undefined2)TVar4;
            bVar10 = false;
          }
          goto LAB_00194d75;
        }
      }
    }
    else {
      iVar5 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
      if (iVar5 == 0) {
        lj_trace_err(J,LJ_TRERR_NOMM);
      }
    }
LAB_00193c0d:
    if ((ix->mobj & 0x1f000000) == 0x8000000) {
      cont = lj_cont_ra;
      if (ix->val != 0) {
        cont = lj_cont_nop;
      }
      func_00 = rec_mm_prep(J,cont);
      pTVar7 = J->base + func_00;
      pTVar8 = J->L->base + func_00;
      *pTVar7 = ix->mobj;
      pTVar7[2] = ix->tab;
      pTVar7[3] = ix->key;
      pTVar8->u64 = (ix->mobjv).u64 & 0x7fffffffffff | 0xfffb800000000000;
      pTVar8[2].gcr.gcptr64 = (uint64_t)ix->tabv;
      pTVar8[3] = ix->keyv;
      if (ix->val == 0) {
        lj_record_call(J,func_00,2);
      }
      else {
        pTVar7[4] = ix->val;
        pTVar8[4] = ix->valv;
        lj_record_call(J,func_00,3);
      }
      return 0;
    }
    if (((((ix->mt == 0x7fff) && (ix->val == 0)) &&
         (((ix->tab & 0x1f000000) == 0xc000000 &&
          ((*(char *)(((ix->tabv).u64 & 0x7fffffffffff) + 10) == '\x03' &&
           ((ix->mobj & 0x1f000000) == 0xb000000)))))) && ((ix->key & 0x1f000000) == 0x4000000)) &&
       ((ix->key & 0xffff) < 0x8000)) {
      pcVar9 = lj_tab_getstr((GCtab *)((ix->mobjv).u64 & 0x7fffffffffff),
                             (GCstr *)((ix->keyv).u64 & 0x7fffffffffff));
      TVar4 = lj_record_constify(J,pcVar9);
      if (TVar4 != 0) {
        return TVar4;
      }
    }
    ix->tab = ix->mobj;
    ix->tabv = ix->mobjv;
    iVar5 = ix->idxchain + -1;
    ix->idxchain = iVar5;
    if (iVar5 == 0) {
      lj_trace_err(J,LJ_TRERR_IDXLOOP);
    }
  } while( true );
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  IRRef rbref;
  IRType1 rbguard;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lj_assertJ(ix->idxchain != 0, "bad usage");
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func + LJ_FR2;
      TValue *tv = J->L->base + func + LJ_FR2;
      base[-LJ_FR2] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv-LJ_FR2, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
#if LJ_HASBUFFER
    /* The index table of buffer objects is treated as immutable. */
    if (ix->mt == TREF_NIL && !ix->val &&
	tref_isudata(ix->tab) && udataV(&ix->tabv)->udtype == UDTYPE_BUFFER &&
	tref_istab(ix->mobj) && tref_isstr(ix->key) && tref_isk(ix->key)) {
      cTValue *val = lj_tab_getstr(tabV(&ix->mobjv), strV(&ix->keyv));
      TRef tr = lj_record_constify(J, val);
      if (tr) return tr;  /* Specialize to the value, i.e. a method. */
    }
#endif
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix, &rbref, &rbguard);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (tref_ref(res) < rbref) {  /* HREFK + load forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tref_ref(xref) < rbref) {  /* HREFK forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_PGC),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lj_assertJ(hasmm, "inconsistent metamethod handling");
	goto handlemm;
      }
      lj_assertJ(!hasmm, "inconsistent metamethod handling");
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key)) {  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	} else if (tref_isnum(key)) {
	  if (tref_isk(key)) {
	    if (tvismzero(&ix->keyv))
	      key = lj_ir_knum_zero(J);  /* Canonicalize -0.0 to +0.0. */
	  } else {
	    emitir(IRTG(IR_EQ, IRT_NUM), key, key);  /* Check for !NaN. */
	  }
	}
	xref = emitir(IRT(IR_NEWREF, IRT_PGC), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
#ifdef LUAJIT_ENABLE_TABLE_BUMP
	if ((J->flags & JIT_F_OPT_SINK))  /* Avoid a separate flag. */
	  rec_idx_bump(J, ix);
#endif
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_PGC), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}